

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O0

void test45(char *infile,char *password,char *outfile,char *xarg)

{
  int iVar1;
  unsigned_long local_38;
  unsigned_long size;
  char *buf;
  char *xarg_local;
  char *outfile_local;
  char *password_local;
  char *infile_local;
  
  size = 0;
  local_38 = 0;
  buf = xarg;
  xarg_local = outfile;
  outfile_local = password;
  password_local = infile;
  read_file_into_memory(xarg,(char **)&size,&local_38);
  iVar1 = qpdf_read(qpdf,password_local,outfile_local);
  if (iVar1 != 0) {
    __assert_fail("qpdf_read(qpdf, infile, password) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x50d,"void test45(const char *, const char *, const char *, const char *)");
  }
  iVar1 = qpdf_update_from_json_data(qpdf,size,local_38);
  if (iVar1 == 0) {
    qpdf_init_write(qpdf,xarg_local);
    qpdf_set_static_ID(qpdf,1);
    qpdf_write(qpdf);
    report_errors();
    free((void *)size);
    return;
  }
  __assert_fail("qpdf_update_from_json_data(qpdf, buf, size) == QPDF_SUCCESS",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                ,0x50e,"void test45(const char *, const char *, const char *, const char *)");
}

Assistant:

static void
test45(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    char* buf = NULL;
    unsigned long size = 0;
    read_file_into_memory(xarg, &buf, &size);
    assert(qpdf_read(qpdf, infile, password) == 0);
    assert(qpdf_update_from_json_data(qpdf, buf, size) == QPDF_SUCCESS);
    qpdf_init_write(qpdf, outfile);
    qpdf_set_static_ID(qpdf, QPDF_TRUE);
    qpdf_write(qpdf);
    report_errors();
    free(buf);
}